

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseShiftOperator(StructuralParser *this)

{
  bool bVar1;
  Op op;
  Expression *a;
  TokenType token;
  Expression *b;
  Context context;
  Context CStack_48;
  
  a = parseAdditionSubtraction(this);
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,(TokenType)0x2a352d,(TokenType)0x2a3534,(TokenType)0x2a3533);
    if (!bVar1) break;
    getContext(&CStack_48,this);
    token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::skip(&this->super_SOULTokeniser);
    op = getBinaryOpForToken(token);
    b = parseAdditionSubtraction(this);
    a = createBinaryOperator(this,&CStack_48,a,b,op);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&CStack_48);
  }
  return a;
}

Assistant:

AST::Expression& parseShiftOperator()
    {
        for (pool_ref<AST::Expression> a = parseAdditionSubtraction();;)
        {
            if (! matchesAny (Operator::leftShift, Operator::rightShift, Operator::rightShiftUnsigned))
                return a;

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseAdditionSubtraction(), type);
        }
    }